

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_terminateCase(qpTestLog *log,qpTestResult result)

{
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = s_qpTestResultMap[(int)result].string;
  deMutex_lock(log->lock);
  bVar2 = log->isCaseOpen != 0;
  if (bVar2) {
    qpXmlWriter_flush(log->writer);
    fprintf((FILE *)log->outputFile,"\n#terminateTestCaseResult %s\n",pcVar1);
    fflush((FILE *)log->outputFile);
    log->isCaseOpen = 0;
  }
  deMutex_unlock(log->lock);
  return (uint)bVar2;
}

Assistant:

deBool qpTestLog_terminateCase (qpTestLog* log, qpTestResult result)
{
	const char* resultStr = QP_LOOKUP_STRING(s_qpTestResultMap, result);

	DE_ASSERT(log);
	DE_ASSERT(result == QP_TEST_RESULT_CRASH || result == QP_TEST_RESULT_TIMEOUT);

	deMutex_lock(log->lock);

	if (!log->isCaseOpen)
	{
		deMutex_unlock(log->lock);
		return DE_FALSE; /* Soft error. This is called from error handler. */
	}

	/* Flush XML and write #terminateTestCaseResult. */
	qpXmlWriter_flush(log->writer);
	fprintf(log->outputFile, "\n#terminateTestCaseResult %s\n", resultStr);
	qpTestLog_flushFile(log);

	log->isCaseOpen = DE_FALSE;

#if defined(DE_DEBUG)
	ContainerStack_reset(&log->containerStack);
#endif

	deMutex_unlock(log->lock);
	return DE_TRUE;
}